

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Internal::otfs_subsume_clause(Internal *this,Clause *subsuming,Clause *subsumed)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Clause *in_RDX;
  Internal *in_RSI;
  Proof *in_RDI;
  uint64_t in_stack_ffffffffffffffd8;
  
  in_RDI[0x25].clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)in_RDI[0x25].clause.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1);
  if ((*(uint *)&in_RDX->field_0x8 >> 0xb & 1) == 0) {
    in_RDI[0x25].proof_chain.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)in_RDI[0x25].proof_chain.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  else {
    in_RDI[0x25].clause_id = in_RDI[0x25].clause_id + 1;
  }
  if (((*(uint *)&in_RDX->field_0x8 >> 0xb & 1) == 0) &&
     (uVar1._0_1_ = in_RSI->preprocessing, uVar1._1_1_ = in_RSI->protected_reasons,
     uVar1._2_1_ = in_RSI->force_saved_phase, uVar1._3_1_ = in_RSI->searching_lucky_phases,
     (uVar1 >> 0xb & 1) != 0)) {
    uVar3._0_1_ = in_RSI->preprocessing;
    uVar3._1_1_ = in_RSI->protected_reasons;
    uVar3._2_1_ = in_RSI->force_saved_phase;
    uVar3._3_1_ = in_RSI->searching_lucky_phases;
    uVar3 = uVar3 & 0xfffff7ff;
    in_RSI->preprocessing = (bool)(char)uVar3;
    in_RSI->protected_reasons = (bool)(char)(uVar3 >> 8);
    in_RSI->force_saved_phase = (bool)(char)(uVar3 >> 0x10);
    in_RSI->searching_lucky_phases = (bool)(char)(uVar3 >> 0x18);
    if (in_RDI[0x18].proof_chain.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      Proof::strengthen(in_RDI,in_stack_ffffffffffffffd8);
    }
    mark_garbage(in_RSI,in_RDX);
    in_RDI[0x21].internal = (Internal *)((long)&(in_RDI[0x21].internal)->mode + 1);
    in_RDI[0x21].clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)in_RDI[0x21].clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
    iVar2._0_1_ = in_RSI->external_prop_is_lazy;
    iVar2._1_1_ = in_RSI->forced_backt_allowed;
    iVar2._2_1_ = in_RSI->private_steps;
    iVar2._3_1_ = in_RSI->rephased;
    *(long *)&in_RDI[0x28].redundant = (long)iVar2 + *(long *)&in_RDI[0x28].redundant;
    in_RDI[0x20].lratbuilder = (LratBuilder *)((long)&in_RDI[0x20].lratbuilder[-1].stats.units + 7);
    in_RDI[0x21].clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)in_RDI[0x21].clause.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + -1);
  }
  else {
    mark_garbage(in_RSI,in_RDX);
  }
  return;
}

Assistant:

inline void Internal::otfs_subsume_clause (Clause *subsuming,
                                           Clause *subsumed) {
  stats.subsumed++;
  assert (subsuming->size <= subsumed->size);
  LOG (subsumed, "subsumed");
  if (subsumed->redundant)
    stats.subred++;
  else
    stats.subirr++;
  if (subsumed->redundant || !subsuming->redundant) {
    mark_garbage (subsumed);
    return;
  }
  LOG ("turning redundant subsuming clause into irredundant clause");
  subsuming->redundant = false;
  if (proof)
    proof->strengthen (subsuming->id);
  mark_garbage (subsumed);
  stats.current.irredundant++;
  stats.added.irredundant++;
  stats.irrlits += subsuming->size;
  assert (stats.current.redundant > 0);
  stats.current.redundant--;
  assert (stats.added.redundant > 0);
  stats.added.redundant--;
  // ... and keep 'stats.added.total'.
}